

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall icu_63::UnicodeString::releaseBuffer(UnicodeString *this,int32_t newLength)

{
  char16_t *pcVar1;
  ushort uVar2;
  char16_t *pcVar3;
  int iVar4;
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (-2 < newLength && (uVar2 & 0x10) != 0) {
    if ((uVar2 & 2) == 0) {
      iVar4 = (this->fUnion).fFields.fCapacity;
    }
    else {
      iVar4 = 0x1b;
    }
    if (newLength == -1) {
      if ((uVar2 & 2) == 0) {
        pcVar3 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (this->fUnion).fStackFields.fBuffer;
      }
      pcVar1 = pcVar3 + iVar4;
      newLength = 0;
      for (; (pcVar3 < pcVar1 && (*pcVar3 != L'\0')); pcVar3 = pcVar3 + 1) {
        newLength = newLength + 1;
      }
    }
    else if (iVar4 < newLength) {
      newLength = iVar4;
    }
    setLength(this,newLength);
    *(byte *)&this->fUnion = *(byte *)&this->fUnion & 0xef;
  }
  return;
}

Assistant:

void
UnicodeString::releaseBuffer(int32_t newLength) {
  if(fUnion.fFields.fLengthAndFlags&kOpenGetBuffer && newLength>=-1) {
    // set the new fLength
    int32_t capacity=getCapacity();
    if(newLength==-1) {
      // the new length is the string length, capped by fCapacity
      const UChar *array=getArrayStart(), *p=array, *limit=array+capacity;
      while(p<limit && *p!=0) {
        ++p;
      }
      newLength=(int32_t)(p-array);
    } else if(newLength>capacity) {
      newLength=capacity;
    }
    setLength(newLength);
    fUnion.fFields.fLengthAndFlags&=~kOpenGetBuffer;
  }
}